

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

void LoadProtos(LoadState *S,Proto *f)

{
  int iVar1;
  Proto **ppPVar2;
  Proto *pPVar3;
  int local_1c;
  int n;
  int i;
  Proto *f_local;
  LoadState *S_local;
  
  iVar1 = LoadInt(S);
  ppPVar2 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,(long)iVar1 << 3);
  f->p = ppPVar2;
  f->sizep = iVar1;
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    f->p[local_1c] = (Proto *)0x0;
  }
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    pPVar3 = luaF_newproto(S->L);
    f->p[local_1c] = pPVar3;
    LoadFunction(S,f->p[local_1c],f->source);
  }
  return;
}

Assistant:

static void LoadProtos (LoadState *S, Proto *f) {
  int i;
  int n = LoadInt(S);
  f->p = luaM_newvector(S->L, n, Proto *);
  f->sizep = n;
  for (i = 0; i < n; i++)
    f->p[i] = NULL;
  for (i = 0; i < n; i++) {
    f->p[i] = luaF_newproto(S->L);
    LoadFunction(S, f->p[i], f->source);
  }
}